

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.c
# Opt level: O2

void on_receive(quicly_stream_t *stream,size_t off,void *src,size_t len)

{
  int iVar1;
  size_t __n;
  ptls_iovec_t pVar2;
  
  iVar1 = quicly_streambuf_ingress_receive(stream,off,src,len);
  if (iVar1 != 0) {
    return;
  }
  pVar2 = quicly_recvbuf_get(stream,(ptls_buffer_t *)((long)stream->data + 0x28));
  __n = pVar2.len;
  if (((ctx.tls)->certificates).count == 0) {
    fwrite(pVar2.base,1,__n,_stdout);
    fflush(_stdout);
    if ((stream->recvstate).received.num_ranges == 0) {
      quicly_close(stream->conn,0,"");
    }
  }
  else if (((stream->sendstate).final_size == 0xffffffffffffffff) && (__n != 0)) {
    quicly_streambuf_egress_write(stream,pVar2.base,__n);
    if ((stream->recvstate).received.num_ranges == 0) {
      quicly_streambuf_egress_shutdown(stream);
    }
  }
  quicly_recvbuf_shift(stream,(ptls_buffer_t *)((long)stream->data + 0x28),__n);
  return;
}

Assistant:

static void on_receive(quicly_stream_t *stream, size_t off, const void *src, size_t len)
{
    /* read input to receive buffer */
    if (quicly_streambuf_ingress_receive(stream, off, src, len) != 0)
        return;

    /* obtain contiguous bytes from the receive buffer */
    ptls_iovec_t input = quicly_streambuf_ingress_get(stream);

    if (is_server()) {
        /* server: echo back to the client */
        if (quicly_sendstate_is_open(&stream->sendstate) && (input.len > 0)) {
            quicly_streambuf_egress_write(stream, input.base, input.len);
            /* shutdown the stream after echoing all data */
            if (quicly_recvstate_transfer_complete(&stream->recvstate))
                quicly_streambuf_egress_shutdown(stream);
        }
    } else {
        /* client: print to stdout */
        fwrite(input.base, 1, input.len, stdout);
        fflush(stdout);
        /* initiate connection close after receiving all data */
        if (quicly_recvstate_transfer_complete(&stream->recvstate))
            quicly_close(stream->conn, 0, "");
    }

    /* remove used bytes from receive buffer */
    quicly_streambuf_ingress_shift(stream, input.len);
}